

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::InitializeProgressMarks(cmGlobalUnixMakefileGenerator3 *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  *this_01;
  TargetDependSet *pTVar3;
  _Rb_tree_node_base *p_Var4;
  pointer ppcVar5;
  cmGeneratorTarget *gt;
  cmStateSnapshot csnp;
  cmStateSnapshot tsnp;
  cmGeneratorTarget *local_e0;
  cmGlobalUnixMakefileGenerator3 *local_d8;
  string local_d0;
  pointer local_b0;
  pointer local_a8;
  cmLocalGenerator *local_a0;
  pointer local_98;
  cmLocalGenerator *local_90;
  map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *local_88;
  cmStateSnapshot local_80;
  cmStateSnapshot local_68;
  cmStateSnapshot local_48;
  
  local_88 = &this->DirectoryTargetsMap;
  std::
  _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>,_std::_Select1st<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  ::clear(&local_88->_M_t);
  local_a8 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_b0 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_a8 != local_b0) {
    local_d8 = this;
    do {
      local_a0 = *local_a8;
      ppcVar5 = (local_a0->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_98 = (local_a0->GeneratorTargets).
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (ppcVar5 != local_98) {
        do {
          local_e0 = *ppcVar5;
          local_90 = cmGeneratorTarget::GetLocalGenerator(local_e0);
          TVar2 = cmGeneratorTarget::GetType(local_e0);
          this_00 = local_e0;
          bVar1 = true;
          if (TVar2 != INTERFACE_LIBRARY) {
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"EXCLUDE_FROM_ALL","");
            bVar1 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_d0);
            this = local_d8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
          }
          if (bVar1 == false) {
            cmLocalGenerator::GetStateSnapshot(&local_68,local_a0);
            cmLocalGenerator::GetStateSnapshot(&local_48,local_90);
            bVar1 = cmStateSnapshot::IsValid(&local_68);
            if (bVar1) {
              do {
                bVar1 = cmGlobalGenerator::IsExcluded((cmGlobalGenerator *)this,&local_68,&local_48)
                ;
                if (bVar1) break;
                this_01 = (_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                           *)std::
                             map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                             ::operator[](local_88,&local_68);
                std::
                _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                ::_M_insert_unique<cmGeneratorTarget_const*const&>(this_01,&local_e0);
                pTVar3 = cmGlobalGenerator::GetTargetDirectDepends
                                   ((cmGlobalGenerator *)this,local_e0);
                for (p_Var4 = (pTVar3->
                              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                              )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    (_Rb_tree_header *)p_Var4 !=
                    &(pTVar3->
                     super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                     )._M_t._M_impl.super__Rb_tree_header;
                    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
                  local_80.State = *(cmState **)(p_Var4 + 1);
                  std::
                  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  ::_M_insert_unique<cmGeneratorTarget_const*>
                            (this_01,(cmGeneratorTarget **)&local_80);
                }
                cmStateSnapshot::GetBuildsystemDirectoryParent(&local_80,&local_68);
                local_68.Position.Position = local_80.Position.Position;
                local_68.State = local_80.State;
                local_68.Position.Tree = local_80.Position.Tree;
                bVar1 = cmStateSnapshot::IsValid(&local_68);
                this = local_d8;
              } while (bVar1);
            }
          }
          ppcVar5 = ppcVar5 + 1;
        } while (ppcVar5 != local_98);
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != local_b0);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::InitializeProgressMarks()
{
  this->DirectoryTargetsMap.clear();
  // Loop over all targets in all local generators.
  for (cmLocalGenerator* lg : this->LocalGenerators) {
    for (cmGeneratorTarget* gt : lg->GetGeneratorTargets()) {
      cmLocalGenerator* tlg = gt->GetLocalGenerator();

      if (gt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
          gt->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
        continue;
      }

      cmStateSnapshot csnp = lg->GetStateSnapshot();
      cmStateSnapshot tsnp = tlg->GetStateSnapshot();

      // Consider the directory containing the target and all its
      // parents until something excludes the target.
      for (; csnp.IsValid() && !this->IsExcluded(csnp, tsnp);
           csnp = csnp.GetBuildsystemDirectoryParent()) {
        // This local generator includes the target.
        std::set<cmGeneratorTarget const*>& targetSet =
          this->DirectoryTargetsMap[csnp];
        targetSet.insert(gt);

        // Add dependencies of the included target.  An excluded
        // target may still be included if it is a dependency of a
        // non-excluded target.
        for (cmTargetDepend const& tgtdep : this->GetTargetDirectDepends(gt)) {
          targetSet.insert(tgtdep);
        }
      }
    }
  }
}